

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_Randomized::_Run(_Test_Randomized *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Slice SVar5;
  Random rnd;
  string v;
  uint local_b4;
  long local_b0;
  ulong local_a8;
  string local_a0;
  char *local_80;
  size_t sStack_78;
  char local_70 [16];
  string local_60;
  Slice local_40;
  
  local_b0 = 0;
  do {
    Harness::Init(&this->super_Harness,(TestArgs *)(kTestArgList + local_b0 * 0xc));
    iVar1 = test::RandomSeed();
    local_b4 = iVar1 + 5U & 0x7fffffff;
    if ((local_b4 == 0x7fffffff) || (local_b4 == 0)) {
      local_b4 = 1;
    }
    local_b0 = local_b0 + 1;
    uVar4 = 0;
    do {
      uVar2 = (int)uVar4 * -0x33333333;
      local_a8 = uVar4;
      if ((uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f) < 0x1999999a) {
        fprintf(_stderr,"case %d of %d: num_entries = %d\n",local_b0,0x10,uVar4);
      }
      uVar2 = (uint)local_a8;
      uVar4 = local_a8 & 0xffffffff;
      while (uVar2 != 0) {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        uVar3 = (int)((ulong)local_b4 * 0x41a7 >> 0x1f) +
                ((uint)((ulong)local_b4 * 0x41a7) & 0x7fffffff);
        uVar2 = uVar3 + 0x80000001;
        if (-1 < (int)uVar3) {
          uVar2 = uVar3;
        }
        local_a0._M_string_length = 0;
        uVar3 = (int)((ulong)uVar2 * 0x41a7 >> 0x1f) + ((uint)((ulong)uVar2 * 0x41a7) & 0x7fffffff);
        local_b4 = uVar3 + 0x80000001;
        if (-1 < (int)uVar3) {
          local_b4 = uVar3;
        }
        local_a0.field_2._M_local_buf[0] = '\0';
        test::RandomKey_abi_cxx11_
                  (&local_60,(test *)&local_b4,
                   (Random *)(ulong)(~(-1 << (sbyte)(uVar2 % 5)) & local_b4),uVar2 % 5);
        uVar3 = (int)((ulong)local_b4 * 0x41a7 >> 0x1f) +
                ((uint)((ulong)local_b4 * 0x41a7) & 0x7fffffff);
        uVar2 = uVar3 + 0x80000001;
        if (-1 < (int)uVar3) {
          uVar2 = uVar3;
        }
        uVar3 = (int)((ulong)uVar2 * 0x41a7 >> 0x1f) + ((uint)((ulong)uVar2 * 0x41a7) & 0x7fffffff);
        local_b4 = uVar3 + 0x80000001;
        if (-1 < (int)uVar3) {
          local_b4 = uVar3;
        }
        SVar5 = test::RandomString((Random *)&local_b4,
                                   ~(-1 << ((char)uVar2 + (char)(uVar2 / 6) * -6 & 0x1fU)) &
                                   local_b4,&local_a0);
        local_80 = local_70;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,SVar5.data_,SVar5.data_ + SVar5.size_);
        local_40.data_ = local_80;
        local_40.size_ = sStack_78;
        Constructor::Add((this->super_Harness).constructor_,&local_60,&local_40);
        if (local_80 != local_70) {
          operator_delete(local_80);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        uVar2 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar2;
      }
      Harness::Test(&this->super_Harness,(Random *)&local_b4);
      uVar2 = (uint)local_a8;
      uVar3 = uVar2 + 1;
      if (0x31 < uVar2) {
        uVar3 = uVar2 + 200;
      }
      uVar4 = (ulong)uVar3;
    } while (uVar3 < 2000);
  } while (local_b0 != 0x10);
  return;
}

Assistant:

TEST(Harness, Randomized) {
  for (int i = 0; i < kNumTestArgs; i++) {
    Init(kTestArgList[i]);
    Random rnd(test::RandomSeed() + 5);
    for (int num_entries = 0; num_entries < 2000;
         num_entries += (num_entries < 50 ? 1 : 200)) {
      if ((num_entries % 10) == 0) {
        fprintf(stderr, "case %d of %d: num_entries = %d\n", (i + 1),
                int(kNumTestArgs), num_entries);
      }
      for (int e = 0; e < num_entries; e++) {
        std::string v;
        Add(test::RandomKey(&rnd, rnd.Skewed(4)),
            test::RandomString(&rnd, rnd.Skewed(5), &v).ToString());
      }
      Test(&rnd);
    }
  }
}